

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRef *pPVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  PrimRef *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  size_t sVar9;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar12;
  size_t sVar13;
  uint index;
  ulong uVar14;
  unsigned_long uVar15;
  size_t *psVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  size_t local_50;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  uVar15 = r->_end;
  aVar17 = _DAT_01f7aa00;
  aVar18 = _DAT_01f7a9f0;
  aVar19 = _DAT_01f7a9f0;
  aVar20 = _DAT_01f7aa00;
  if (uVar14 < uVar15) {
    sVar13 = 0;
    local_50 = k;
    do {
      uVar12 = uVar14 & 0xffffffff;
      pBVar3 = (this->super_Points).vertices.items;
      if (uVar12 < (pBVar3->super_RawBufferView).num) {
        psVar16 = &pBVar3[itime].super_RawBufferView.stride;
        sVar9 = itime;
        do {
          pfVar1 = (float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12);
          fVar29 = pfVar1[3];
          auVar21._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar21._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar21._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar21._12_4_ = -(uint)(fVar29 <= -1.844e+18);
          auVar24._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar24._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar24._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar24._12_4_ = -(uint)(1.844e+18 <= fVar29);
          if ((fVar29 < 0.0) ||
             (uVar11 = movmskps((int)((RawBufferView *)(psVar16 + -2))->ptr_ofs,auVar21 | auVar24),
             (char)uVar11 != '\0')) goto LAB_009ee578;
          sVar9 = sVar9 + 1;
          psVar16 = psVar16 + 7;
        } while (sVar9 <= itime);
        psVar16 = &pBVar3[itime + 1].super_RawBufferView.stride;
        uVar10 = itime + 1;
        do {
          pfVar1 = (float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + *psVar16 * uVar12);
          fVar29 = pfVar1[3];
          auVar22._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
          auVar22._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
          auVar22._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
          auVar22._12_4_ = -(uint)(fVar29 <= -1.844e+18);
          auVar25._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
          auVar25._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
          auVar25._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
          auVar25._12_4_ = -(uint)(1.844e+18 <= fVar29);
          if ((fVar29 < 0.0) ||
             (uVar11 = movmskps((int)((RawBufferView *)(psVar16 + -2))->ptr_ofs,auVar22 | auVar25),
             (char)uVar11 != '\0')) goto LAB_009ee578;
          uVar10 = uVar10 + 1;
          psVar16 = psVar16 + 7;
        } while (uVar10 <= itime + 1);
        pfVar1 = (float *)(pBVar3[itime].super_RawBufferView.ptr_ofs +
                          pBVar3[itime].super_RawBufferView.stride * uVar14);
        fVar8 = pfVar1[3];
        fVar29 = (this->super_Points).maxRadiusScale;
        fVar26 = *pfVar1 - fVar29 * fVar8;
        fVar27 = pfVar1[1] - fVar29 * fVar8;
        fVar28 = pfVar1[2] - fVar29 * fVar8;
        aVar23._0_4_ = fVar29 * fVar8 + *pfVar1;
        aVar23._4_4_ = fVar29 * fVar8 + pfVar1[1];
        aVar23._8_4_ = fVar29 * fVar8 + pfVar1[2];
        aVar23.m128[3] = (float)uVar14;
        auVar5._4_4_ = fVar27;
        auVar5._0_4_ = fVar26;
        auVar5._8_4_ = fVar28;
        auVar5._12_4_ = geomID;
        aVar18.m128 = (__m128)minps(aVar18.m128,auVar5);
        aVar17.m128 = (__m128)maxps(aVar17.m128,aVar23.m128);
        pPVar4 = prims->items;
        pPVar2 = pPVar4 + local_50;
        (pPVar2->lower).field_0.m128[0] = fVar26;
        (pPVar2->lower).field_0.m128[1] = fVar27;
        (pPVar2->lower).field_0.m128[2] = fVar28;
        (pPVar2->lower).field_0.m128[3] = (float)geomID;
        fVar29 = (float)geomID + (float)uVar14;
        auVar6._4_4_ = fVar27 + aVar23._4_4_;
        auVar6._0_4_ = fVar26 + aVar23._0_4_;
        auVar6._8_4_ = fVar28 + aVar23._8_4_;
        auVar6._12_4_ = fVar29;
        aVar19.m128 = (__m128)minps(aVar19.m128,auVar6);
        auVar7._4_4_ = fVar27 + aVar23._4_4_;
        auVar7._0_4_ = fVar26 + aVar23._0_4_;
        auVar7._8_4_ = fVar28 + aVar23._8_4_;
        auVar7._12_4_ = fVar29;
        aVar20.m128 = (__m128)maxps(aVar20.m128,auVar7);
        sVar13 = sVar13 + 1;
        pPVar4[local_50].upper.field_0 = aVar23;
        uVar15 = r->_end;
        local_50 = local_50 + 1;
      }
LAB_009ee578:
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar15);
  }
  else {
    sVar13 = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar17;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->end = sVar13;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }